

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_string(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  int iVar1;
  int32_t isz;
  
  if (*(int *)&a->name < 0) {
    iVar1 = (*ctxt->standard_error)(ctxt,3);
  }
  else {
    iVar1 = (*ctxt->do_write)(ctxt,&stack0xffffffffffffffec,4,&ctxt->output_file_offset);
  }
  if (iVar1 == 0) {
    iVar1 = (*ctxt->do_write)(ctxt,a->type_name,(long)*(int *)&a->name,&ctxt->output_file_offset);
  }
  return iVar1;
}

Assistant:

static exr_result_t
save_string (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t       rv;
    exr_attr_string_t* tmp = a->string;

    rv = save_attr_sz (ctxt, (size_t) tmp->length);
    if (rv == EXR_ERR_SUCCESS)
        rv = ctxt->do_write (
            ctxt,
            tmp->str,
            (uint64_t) (tmp->length),
            &(ctxt->output_file_offset));
    return rv;
}